

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O3

void cov::timer::delay(time_unit unit,timer_t time)

{
  int iVar1;
  int *piVar2;
  timespec local_18;
  
  switch(unit) {
  case nano_sec:
    if (0 < (long)time) {
      local_18.tv_sec = time / 1000000000;
      local_18.tv_nsec = time % 1000000000;
      do {
        iVar1 = nanosleep(&local_18,&local_18);
        if (iVar1 != -1) {
          return;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
    break;
  case micro_sec:
    if (0 < (long)time) {
      local_18.tv_sec = time / 1000000;
      local_18.tv_nsec = (time % 1000000) * 1000;
      do {
        iVar1 = nanosleep(&local_18,&local_18);
        if (iVar1 != -1) {
          return;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
    break;
  case milli_sec:
    if (0 < (long)time) {
      local_18.tv_sec = time / 1000;
      local_18.tv_nsec = (time % 1000) * 1000000;
      do {
        iVar1 = nanosleep(&local_18,&local_18);
        if (iVar1 != -1) {
          return;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
    break;
  case second:
    if (0 < (long)time) {
      local_18.tv_nsec = 0;
      local_18.tv_sec = time;
      do {
        iVar1 = nanosleep(&local_18,&local_18);
        if (iVar1 != -1) {
          return;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
    break;
  case minute:
    if (0 < (long)time) {
      local_18.tv_sec = time * 0x3c;
      local_18.tv_nsec = 0;
      do {
        iVar1 = nanosleep(&local_18,&local_18);
        if (iVar1 != -1) {
          return;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
  }
  return;
}

Assistant:

static void delay(time_unit unit, timer_t time)
		{
			switch (unit) {
			case time_unit::nano_sec:
				std::this_thread::sleep_for(std::chrono::nanoseconds(time));
				break;
			case time_unit::micro_sec:
				std::this_thread::sleep_for(std::chrono::microseconds(time));
				break;
			case time_unit::milli_sec:
				std::this_thread::sleep_for(std::chrono::milliseconds(time));
				break;
			case time_unit::second:
				std::this_thread::sleep_for(std::chrono::seconds(time));
				break;
			case time_unit::minute:
				std::this_thread::sleep_for(std::chrono::minutes(time));
				break;
			}
		}